

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void soul::SanityCheckPass::throwErrorIfMultidimensionalArray(Context *location,Type *type)

{
  Category CVar1;
  Structure *pSVar2;
  char (*args) [25];
  Member *m;
  Member *type_00;
  long lVar3;
  Type elementType;
  Type local_68;
  CompileMessage local_50;
  
  CVar1 = type->category;
  if (CVar1 == array) {
    Type::getArrayElementType(&local_68,type);
    if (local_68.category == array) {
      Errors::notYetImplemented<char_const(&)[25]>
                (&local_50,(Errors *)"Multi-dimensional arrays",args);
      AST::Context::throwError(location,&local_50,false);
    }
    throwErrorIfMultidimensionalArray(location,&local_68);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_68.structure);
    CVar1 = type->category;
  }
  if (CVar1 == structure) {
    pSVar2 = Type::getStructRef(type);
    type_00 = (pSVar2->members).items;
    for (lVar3 = (pSVar2->members).numActive << 6; lVar3 != 0; lVar3 = lVar3 + -0x40) {
      throwErrorIfMultidimensionalArray(location,&type_00->type);
      type_00 = type_00 + 1;
    }
  }
  return;
}

Assistant:

static void throwErrorIfMultidimensionalArray (const AST::Context& location, const Type& type)
    {
        if (type.isArray())
        {
            auto elementType = type.getArrayElementType();

            if (elementType.isArray())
                location.throwError (Errors::notYetImplemented ("Multi-dimensional arrays"));

            throwErrorIfMultidimensionalArray (location, elementType);
        }

        if (type.isStruct())
            for (auto& m : type.getStructRef().getMembers())
                throwErrorIfMultidimensionalArray (location, m.type);
    }